

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_runtime.h
# Opt level: O1

void __thiscall
tvm::runtime::GraphRuntime::Node::LoadAttrs(Node *this,JSONReader *reader,TVMOpParam *param)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ostream *poVar5;
  LogCheckError _check_err;
  string value;
  string key;
  LogCheckError local_208;
  string local_200;
  int local_1dc;
  string local_1d8;
  LogMessageFatal local_1b8;
  
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  local_200._M_string_length = 0;
  uVar3 = 0;
  local_200.field_2._M_local_buf[0] = '\0';
  dmlc::JSONReader::BeginObject(reader);
  while( true ) {
    bVar1 = dmlc::JSONReader::NextObjectItem(reader,&local_1d8);
    if (!bVar1) break;
    dmlc::JSONReader::ReadString(reader,&local_200);
    iVar2 = std::__cxx11::string::compare((char *)&local_1d8);
    if (iVar2 == 0) {
      std::__cxx11::string::_M_assign((string *)param);
      uVar3 = uVar3 | 1;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_1d8);
      if (iVar2 == 0) {
        uVar4 = strtoul(local_200._M_dataplus._M_p,(char **)0x0,10);
        param->num_inputs = (uint32_t)uVar4;
        uVar3 = uVar3 | 2;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_1d8);
        if (iVar2 == 0) {
          uVar4 = strtoul(local_200._M_dataplus._M_p,(char **)0x0,10);
          param->num_outputs = (uint32_t)uVar4;
          uVar3 = uVar3 | 4;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_1d8);
          if (iVar2 == 0) {
            uVar4 = strtoul(local_200._M_dataplus._M_p,(char **)0x0,10);
            param->flatten_data = (uint32_t)uVar4;
            uVar3 = uVar3 | 8;
          }
        }
      }
    }
  }
  local_1dc = 0xf;
  local_1b8._0_4_ = uVar3;
  dmlc::LogCheck_EQ<int,int>((dmlc *)&local_208,(int *)&local_1b8,&local_1dc);
  if (local_208.str != (string *)0x0) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1b8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/./tvm/src/runtime/graph/graph_runtime.h"
               ,0xf4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"Check failed: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8,"bitmask == 1|2|4|8",0x12);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1b8,((local_208.str)->_M_dataplus)._M_p,
                        (local_208.str)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"invalid format",0xe);
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1b8);
  }
  dmlc::LogCheckError::~LogCheckError(&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void LoadAttrs(dmlc::JSONReader *reader, TVMOpParam* param) {
      int bitmask = 0;
      std::string key, value;
      reader->BeginObject();
      while (reader->NextObjectItem(&key)) {
        reader->Read(&value);
        if (key == "func_name") {
          param->func_name = value;
          bitmask |= 1;
        } else if (key == "num_inputs") {
          param->num_inputs = strtoul(value.c_str(), nullptr, 10);
          bitmask |= 2;
        } else if (key == "num_outputs") {
          param->num_outputs = strtoul(value.c_str(), nullptr, 10);
          bitmask |= 4;
        } else if (key == "flatten_data") {
          param->flatten_data = strtoul(value.c_str(), nullptr, 10);
          bitmask |= 8;
        }
      }
      CHECK_EQ(bitmask, 1|2|4|8) << "invalid format";
    }